

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O2

string * __thiscall
cmPolicies::GetPolicyWarning_abi_cxx11_(string *__return_storage_ptr__,cmPolicies *this,PolicyID id)

{
  ostream *poVar1;
  char *pcVar2;
  char *pcVar3;
  ostringstream msg;
  ostream oStack_198;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oStack_198);
  poVar1 = std::operator<<(&oStack_198,"Policy ");
  pcVar2 = idToString((PolicyID)this);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1," is not set: ");
  pcVar3 = idToShortDescription((PolicyID)this);
  poVar1 = std::operator<<(poVar1,pcVar3);
  poVar1 = std::operator<<(poVar1,"  Run \"cmake --help-policy ");
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,
                  "\" for policy details.  Use the cmake_policy command to set the policy and suppress this warning."
                 );
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string cmPolicies::GetPolicyWarning(cmPolicies::PolicyID id)
{
  std::ostringstream msg;
  msg <<
    "Policy " << idToString(id) << " is not set: "
    "" << idToShortDescription(id) << "  "
    "Run \"cmake --help-policy " << idToString(id) << "\" for "
    "policy details.  "
    "Use the cmake_policy command to set the policy "
    "and suppress this warning.";
  return msg.str();
}